

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

stbi_uc * hdr_load_rgbe(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  stbi_uc *__ptr;
  int iVar9;
  char *pcVar10;
  stbi_uc *psVar11;
  uint uVar12;
  char *pcVar13;
  bool bVar14;
  stbi_uc *local_470;
  char *local_440;
  char buffer [1024];
  
  hdr_gettoken(s,buffer);
  iVar1 = bcmp(buffer,"#?RADIANCE",0xb);
  if (iVar1 == 0) {
    bVar14 = false;
    while (hdr_gettoken(s,buffer), buffer[0] != '\0') {
      iVar1 = bcmp(buffer,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar1 == 0) {
        bVar14 = true;
      }
    }
    pcVar13 = "Unsupported HDR format";
    if (bVar14) {
      hdr_gettoken(s,buffer);
      iVar1 = bcmp(buffer,"-Y ",3);
      if (iVar1 == 0) {
        local_440 = buffer + 3;
        lVar7 = strtol(local_440,&local_440,10);
        local_440 = local_440 + 2;
        do {
          pcVar10 = local_440;
          local_440 = pcVar10 + 1;
        } while (pcVar10[-2] == ' ');
        if (((pcVar10[-2] == '+') && (pcVar10[-1] == 'X')) && (*pcVar10 == ' ')) {
          iVar6 = 0;
          lVar8 = strtol(local_440,(char **)0x0,10);
          uVar12 = (uint)lVar8;
          *x = uVar12;
          iVar1 = (int)lVar7;
          *y = iVar1;
          *comp = 4;
          __ptr = (stbi_uc *)malloc((long)(int)(iVar1 * uVar12 * 4));
          local_470 = __ptr;
          if (uVar12 - 0x8000 < 0xffff8008) goto LAB_001c42bf;
          iVar9 = 0;
          iVar6 = 0;
          if (0 < iVar1) {
            iVar6 = iVar1;
          }
          while( true ) {
            if (iVar9 == iVar6) {
              return __ptr;
            }
            iVar2 = get8(s);
            iVar3 = get8(s);
            uVar4 = get8(s);
            if (((iVar2 != 2) || (iVar3 != 2)) || ((uVar4 & 0x80) != 0)) {
              *local_470 = (stbi_uc)iVar2;
              local_470[1] = (stbi_uc)iVar3;
              local_470[2] = (stbi_uc)uVar4;
              iVar6 = get8(s);
              local_470[3] = (stbi_uc)iVar6;
              local_470 = local_470 + 4;
              iVar6 = 0;
              iVar9 = 1;
              do {
                getn(s,local_470,4);
                local_470 = local_470 + 4;
                iVar9 = iVar9 + 1;
                while ((int)uVar12 <= iVar9) {
                  iVar6 = iVar6 + 1;
LAB_001c42bf:
                  iVar9 = 0;
                  if (iVar1 <= iVar6) {
                    return __ptr;
                  }
                }
              } while( true );
            }
            uVar5 = get8(s);
            if ((uVar5 | uVar4 << 8) != uVar12) break;
            psVar11 = local_470;
            for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
              lVar8 = 0;
              while (iVar2 = (int)lVar8, iVar2 < (int)uVar12) {
                uVar4 = get8(s);
                uVar4 = uVar4 & 0xff;
                if (uVar4 < 0x81) {
                  lVar8 = (long)iVar2;
                  while (bVar14 = uVar4 != 0, uVar4 = uVar4 - 1, bVar14) {
                    iVar2 = get8(s);
                    psVar11[lVar8 * 4] = (stbi_uc)iVar2;
                    lVar8 = lVar8 + 1;
                  }
                }
                else {
                  iVar3 = get8(s);
                  lVar8 = (long)iVar2;
                  for (uVar5 = 0; (uVar4 ^ uVar5) != 0x80; uVar5 = uVar5 + 1) {
                    psVar11[lVar8 * 4] = (stbi_uc)iVar3;
                    lVar8 = lVar8 + 1;
                  }
                }
              }
              psVar11 = psVar11 + 1;
            }
            iVar9 = iVar9 + 1;
            local_470 = local_470 + (uVar12 << 2);
          }
          free(__ptr);
          pcVar13 = "corrupt HDR";
        }
      }
    }
  }
  else {
    pcVar13 = "Corrupt HDR image";
  }
  failure_reason = pcVar13;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *hdr_load_rgbe(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	stbi_uc *rgbe_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epuc("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epuc("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epuc("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

	// RGBE _MUST_ come out as 4 components
   *comp = 4;
	req_comp = 4;

	// Read data
	rgbe_data = (stbi_uc *) malloc(height * width * req_comp * sizeof(stbi_uc));
	//	point to the beginning
	scanline = rgbe_data;

	// Load image data
   // image data is stored as some number of scan lines
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
           main_decode_loop:
            //getn(rgbe, 4);
            getn(s,scanline, 4);
			scanline += 4;
         }
      }
	} else {
		// Read RLE-encoded data
		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            scanline[0] = c1;
            scanline[1] = c2;
            scanline[2] = len;
            scanline[3] = get8(s);
            scanline += 4;
            i = 1;
            j = 0;
            goto main_decode_loop; // yes, this is insane; blame the insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(rgbe_data); return epuc("invalid decoded scanline length", "corrupt HDR"); }
			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
			//	move the scanline on
			scanline += 4 * width;
		}
	}

   return rgbe_data;
}